

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_68f54f::ForcedKeyTestLarge::SetUp(ForcedKeyTestLarge *this)

{
  int iVar1;
  
  libaom_test::EncoderTest::InitializeConfig
            (&this->super_EncoderTest,*(TestMode *)&(this->super_EncoderTest).field_0x3dc);
  iVar1 = this->fwd_kf_enabled_;
  (this->super_EncoderTest).cfg_.rc_end_usage = this->rc_end_usage_;
  (this->super_EncoderTest).cfg_.g_threads = 0;
  (this->super_EncoderTest).cfg_.kf_min_dist = 0;
  (this->super_EncoderTest).cfg_.kf_max_dist = 0x1e;
  (this->super_EncoderTest).cfg_.fwd_kf_enabled = iVar1;
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(encoding_mode_);
    cfg_.rc_end_usage = rc_end_usage_;
    cfg_.g_threads = 0;
    cfg_.kf_max_dist = 30;
    cfg_.kf_min_dist = 0;
    cfg_.fwd_kf_enabled = fwd_kf_enabled_;
  }